

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.hh
# Opt level: O3

void __thiscall
avro::
NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
::doAddName(NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
            *this,string *name)

{
  bool bVar1;
  Exception *this_00;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *msg;
  put_holder<char,_std::char_traits<char>_> local_108;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  
  bVar1 = concepts::
          NameIndexConcept<avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::add(&this->nameIndex_,name,
                (long)(this->leafNameAttributes_).attrs_.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->leafNameAttributes_).attrs_.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5);
  if (bVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&(this->leafNameAttributes_).attrs_,name);
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
            (&local_f0,"Cannot add duplicate name: %1%");
  local_108.put_head =
       boost::io::detail::call_put_head<char,std::char_traits<char>,std::__cxx11::string_const>;
  local_108.put_last =
       boost::io::detail::call_put_last<char,std::char_traits<char>,std::__cxx11::string_const>;
  local_108.arg = name;
  msg = boost::io::detail::
        feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
                  (&local_f0,&local_108);
  Exception::Exception(this_00,msg);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void doAddName(const std::string &name) { 
        if (! nameIndex_.add(name, leafNameAttributes_.size())) {
            throw Exception(boost::format("Cannot add duplicate name: %1%") % name);
        }
        leafNameAttributes_.add(name);
    }